

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

char * __thiscall DnsStats::GetZonePrefix(DnsStats *this,char *dnsName)

{
  uint uVar1;
  uint uVar2;
  DnsPrefixEntry *pDVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  DnsPrefixEntry dpe;
  uint local_54;
  DnsPrefixEntry local_50;
  
  DnsPrefixEntry::DnsPrefixEntry(&local_50);
  if ((this->dnsPrefixTable).tableSize == 0) {
    LoadPrefixTable_from_memory(this);
  }
  uVar5 = 0xffffffff;
  local_54 = 0xffffffff;
  uVar7 = 0;
  pcVar6 = (char *)0x0;
  while( true ) {
    if ((dnsName == (char *)0x0) || (pcVar6 != (char *)0x0)) goto LAB_00162c04;
    if (dnsName[(int)uVar7] == '.') break;
    pcVar6 = dnsName + (int)uVar7;
    local_50.hash = 0;
    local_50.dnsPrefix = pcVar6;
    pDVar3 = BinHash<DnsPrefixEntry>::Retrieve(&this->dnsPrefixTable,&local_50);
    if (pDVar3 != (DnsPrefixEntry *)0x0) {
      if (pDVar3->dnsPrefixClass != DnsPrefixException) {
        if (pDVar3->dnsPrefixClass == DnsPrefixOneLevel) {
          uVar5 = local_54;
        }
        if ((int)uVar5 < 0) break;
        pcVar6 = dnsName + uVar5;
      }
      goto LAB_00162c04;
    }
    pcVar6 = dnsName + (int)uVar7;
    uVar2 = uVar7;
    while( true ) {
      uVar2 = uVar2 + 1;
      if (*pcVar6 == '\0') break;
      if (*pcVar6 == '.') {
        pcVar4 = (char *)0x1;
        pcVar6 = (char *)0x0;
        uVar1 = uVar7;
        local_54 = uVar5;
        goto LAB_00162bd0;
      }
      pcVar6 = pcVar6 + 1;
    }
    pcVar4 = (char *)0x0;
    pcVar6 = dnsName + uVar5;
    uVar2 = uVar7;
    uVar1 = uVar5;
    if ((int)uVar5 < 0) {
      pcVar6 = pcVar4;
    }
LAB_00162bd0:
    uVar5 = uVar1;
    uVar7 = uVar2;
    if ((char)pcVar4 == '\0') goto LAB_00162c04;
  }
  pcVar6 = (char *)0x0;
LAB_00162c04:
  DnsPrefixEntry::~DnsPrefixEntry(&local_50);
  return pcVar6;
}

Assistant:

const char * DnsStats::GetZonePrefix(const char * dnsName)
{
    const char * ret = NULL;
    DnsPrefixEntry dpe;
    DnsPrefixEntry * retrieved;
    int prefixOffset = 0;
    int previousOffset = -1;
    int previousPreviousOffset = -1;

    if (dnsPrefixTable.GetSize() == 0) {
        LoadPrefixTable_from_memory();
    }

    while (ret == NULL && dnsName != NULL && dnsName[prefixOffset] != '.') {
        dpe.dnsPrefix = (char *)(dnsName + prefixOffset);
        dpe.hash = 0;

        if ((retrieved = dnsPrefixTable.Retrieve(&dpe)) != NULL)
        {
            switch (retrieved->dnsPrefixClass) {
            case DnsPrefixOneLevel:
                if (previousPreviousOffset >= 0) {
                    ret = dnsName + previousPreviousOffset;
                }
                break;
            case DnsPrefixException:
                ret = dnsName + prefixOffset;
                break;
            case DnsPrefixStd:
            default:
                if (previousOffset >= 0) {
                    ret = dnsName + previousOffset;
                }
                break;
            }
            break;
        } else {
            int offset = prefixOffset;

            while (dnsName[offset] != 0 && dnsName[offset] != '.') {
                offset++;
            }

            if (dnsName[offset] == 0) {
                if (previousOffset >= 0) {
                    ret = dnsName + previousOffset;
                }
                break;
            } else {
                previousPreviousOffset = previousOffset;
                previousOffset = prefixOffset;
                prefixOffset = offset + 1; /* Add 1 to skip the dot */
            }
        }
    }

    return ret;
}